

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

void __thiscall Packet::respondToGet(Packet *this,socket *socket,FlaggedValue *fv,bool found)

{
  pointer pcVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  uchar res [28];
  error_code local_a8;
  char local_98 [8];
  uint local_90;
  uint local_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  uint uStack_80;
  pointer local_70;
  long local_68;
  pointer *local_60 [3];
  error_category *local_48;
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  uStack_88 = 0;
  local_98[0] = -0x7f;
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\x04';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  uVar2 = (*(int *)&(fv->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(fv->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) + 4;
  local_90 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 * 0x1000000;
  uVar2 = this->opaque;
  local_8c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = fv->flags;
  _uStack_84 = CONCAT44(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18,0x1000000);
  if ((int)CONCAT71(in_register_00000009,found) == 0) {
    local_98[0] = -0x7f;
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\x04';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\x01';
  }
  local_70 = local_98;
  local_68 = 0x1c;
  boost::system::error_code::error_code(&local_a8);
  local_60[0] = &local_70;
  boost::asio::detail::
  write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t>
            (socket,&local_70,(system_error *)local_60,&local_a8);
  if (local_a8.failed_ == true) {
    std::runtime_error::runtime_error((runtime_error *)local_60,"write");
    local_40._M_p = (pointer)((long)&((system_error *)local_60)->m_what + 0x10);
    local_60[0] = &PTR__system_error_00129198;
    local_48 = local_a8.cat_;
    local_38 = 0;
    local_30._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_60);
  }
  pcVar1 = (fv->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = (long)(fv->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pcVar1;
  local_70 = (pointer)0x0;
  if (local_68 != 0) {
    local_70 = pcVar1;
  }
  boost::system::error_code::error_code(&local_a8);
  local_60[0] = &local_70;
  boost::asio::detail::
  write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::const_buffer_const*,boost::asio::detail::transfer_all_t>
            (socket,&local_70,(system_error *)local_60,&local_a8);
  if (local_a8.failed_ != true) {
    return;
  }
  std::runtime_error::runtime_error((runtime_error *)local_60,"write");
  local_40._M_p = (pointer)((long)&((system_error *)local_60)->m_what + 0x10);
  local_60[0] = &PTR__system_error_00129198;
  local_48 = local_a8.cat_;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  boost::throw_exception<boost::system::system_error>((system_error *)local_60);
}

Assistant:

void Packet::respondToGet(socket& socket, const FlaggedValue& fv, bool found) {
  unsigned char res[28] = { 0x81, 0x00, 0x00, 0x00, 0x04, 0x00, 0x00,
                            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                            0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x00 };
  writeUInt32LE(&res[8], fv.value.size() + 4);
  writeUInt32LE(&res[12], opaque);
  writeUInt32LE(&res[24], fv.flags);
  // Section 4.1:
  // If the status code of a response packet is non-nil, the body of the packet
  // will contain a textual error message.
  if (!found) {
    res[7] = 0x01;
  }
  try {
    boost::asio::write(socket, boost::asio::buffer(res));
    boost::asio::write(socket, boost::asio::buffer(fv.value));
  } catch (std::exception& e) {
    std::cerr << e.what() << std::endl;
  }
}